

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalOrder::GetGlobalSinkState(PhysicalOrder *this,ClientContext *context)

{
  bool bVar1;
  OrderGlobalSinkState *this_00;
  ClientConfig *pCVar2;
  pointer pOVar3;
  idx_t iVar4;
  ClientContext *in_RDX;
  RowLayout payload_layout;
  _Head_base<0UL,_duckdb::OrderGlobalSinkState_*,_false> local_a0;
  vector<duckdb::LogicalType,_true> local_98;
  RowLayout local_80;
  
  RowLayout::RowLayout(&local_80);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_98,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &context->registered_state);
  RowLayout::Initialize(&local_80,&local_98,true);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_98);
  this_00 = (OrderGlobalSinkState *)operator_new(800);
  OrderGlobalSinkState::OrderGlobalSinkState(this_00,in_RDX,(PhysicalOrder *)context,&local_80);
  local_a0._M_head_impl = this_00;
  pCVar2 = ClientConfig::GetConfig(in_RDX);
  bVar1 = pCVar2->force_external;
  pOVar3 = unique_ptr<duckdb::OrderGlobalSinkState,_std::default_delete<duckdb::OrderGlobalSinkState>,_true>
           ::operator->((unique_ptr<duckdb::OrderGlobalSinkState,_std::default_delete<duckdb::OrderGlobalSinkState>,_true>
                         *)&local_a0);
  (pOVar3->global_sort_state).external = bVar1;
  iVar4 = PhysicalOperator::GetMaxThreadMemory(in_RDX);
  pOVar3 = unique_ptr<duckdb::OrderGlobalSinkState,_std::default_delete<duckdb::OrderGlobalSinkState>,_true>
           ::operator->((unique_ptr<duckdb::OrderGlobalSinkState,_std::default_delete<duckdb::OrderGlobalSinkState>,_true>
                         *)&local_a0);
  pOVar3->memory_per_thread = iVar4;
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = (_func_int **)local_a0._M_head_impl;
  if (local_80.offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_80);
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalOrder::GetGlobalSinkState(ClientContext &context) const {
	// Get the payload layout from the return types
	RowLayout payload_layout;
	payload_layout.Initialize(types);
	auto state = make_uniq<OrderGlobalSinkState>(context, *this, payload_layout);
	// Set external (can be force with the PRAGMA)
	state->global_sort_state.external = ClientConfig::GetConfig(context).force_external;
	state->memory_per_thread = GetMaxThreadMemory(context);
	return std::move(state);
}